

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void ctemplate::AssertExpandWithCacheIs
               (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
               PerExpandData *per_expand_data,string *is,bool expected)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  char *__s2;
  undefined8 uVar4;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  char *local_48;
  char *buf;
  string *psStack_38;
  bool expected_local;
  string *is_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionary *dict_local;
  string *psStack_18;
  Strip strip_local;
  string *filename_local;
  TemplateCache *cache_local;
  
  buf._7_1_ = expected;
  psStack_38 = is;
  is_local = (string *)per_expand_data;
  per_expand_data_local = (PerExpandData *)dict;
  dict_local._4_4_ = strip;
  psStack_18 = filename;
  filename_local = (string *)cache;
  pcVar3 = ExpandWithCacheIs(cache,filename,strip,dict,per_expand_data,expected);
  local_48 = pcVar3;
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,__s2);
  if (iVar2 != 0) {
    uVar4 = std::__cxx11::string::c_str();
    printf("expected = \'%s\'\n",uVar4);
    printf("actual   = \'%s\'\n",local_48);
  }
  pcVar3 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar3,&local_69);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,psStack_38);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    if (local_48 != (char *)0x0) {
      operator_delete__(local_48);
    }
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xdf,"string(buf) == is");
  pcVar3 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar3,&local_a1);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,psStack_38);
  if (!_Var1) {
    __assert_fail("string(buf) == is",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0xdf,
                  "void ctemplate::AssertExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, const string &, bool)"
                 );
  }
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  exit(1);
}

Assistant:

void AssertExpandWithCacheIs(TemplateCache* cache,
                             const string& filename, Strip strip,
                             const TemplateDictionary *dict,
                             PerExpandData* per_expand_data,
                             const string& is, bool expected) {
  const char* buf = ExpandWithCacheIs(cache, filename, strip, dict,
                                      per_expand_data, expected);
  if (strcmp(buf, is.c_str())) {
    printf("expected = '%s'\n", is.c_str());
    printf("actual   = '%s'\n", buf);
  }
  ASSERT(string(buf) == is);
  delete [] buf;
}